

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::createInstance
          (TextureGatherCubeCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  int iVar2;
  VkPhysicalDeviceProperties *pVVar3;
  TextureGatherInstance *this_00;
  Context *__p;
  TextureFormat *format;
  GatherCubeArgs *__cur;
  pointer __args;
  TextureFormat local_50;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar3 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_50.order = R;
    local_50.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_50.order = (pVVar3->limits).minTexelGatherOffset;
    local_50.type = (pVVar3->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_50.order = ~RGB;
    local_50.type = UNORM_BYTE_44;
  }
  else {
    local_50.order = ~R;
    local_50.type = ~SNORM_INT8;
  }
  generateCubeCaseIterations
            (&iterations,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_50);
  this_00 = (TextureGatherInstance *)operator_new(1000);
  iVar2 = this->m_textureSize;
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGatherCubeInstance_00c00c18;
  *(int *)&this_00->field_0x264 = iVar2;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)0x0;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this_00[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
  __p = (Context *)
        std::
        _Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
        ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                       *)(((long)iterations.
                                 super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)iterations.
                                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x28),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)__p;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = __p;
  *(long *)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode =
       ((long)iterations.
              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)iterations.
             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             ._M_impl.super__Vector_impl_data._M_start) + (long)__p;
  for (__args = iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __args != iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    std::
    _Construct<vkt::sr::(anonymous_namespace)::GatherCubeArgs,vkt::sr::(anonymous_namespace)::GatherCubeArgs_const&>
              ((GatherCubeArgs *)__p,__args);
    __p = (Context *)&__p->m_allocator;
  }
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = __p;
  format = &local_50;
  local_50.order = CHANNELORDER_LAST;
  local_50.type = CHANNELTYPE_LAST;
  tcu::TextureCube::TextureCube
            ((TextureCube *)&this_00[1].super_ShaderRenderCaseInstance.m_sparseContext,format,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  std::
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::~_Vector_base(&iterations.
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                 );
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGatherCubeCase::createInstance (Context& context) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGatherCubeInstance(context, m_baseParams, m_textureSize, iterations);
}